

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O1

ssize_t __thiscall Fl_Preferences::Node::write(Node *this,int __fd,void *__buf,size_t __n)

{
  char *pcVar1;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_00;
  size_t sVar2;
  undefined4 in_register_00000034;
  FILE *__stream;
  char *pcVar3;
  long lVar4;
  
  __stream = (FILE *)CONCAT44(in_register_00000034,__fd);
  if (this->next_ != (Node *)0x0) {
    write(this->next_,__fd,__buf,__n);
  }
  fprintf(__stream,"\n[%s]\n\n",this->path_);
  __buf_00 = extraout_RDX;
  if (0 < this->nEntry_) {
    lVar4 = 0;
    do {
      __n = lVar4 * 0x10;
      pcVar1 = this->entry_[lVar4].name;
      pcVar3 = this->entry_[lVar4].value;
      if (pcVar3 == (char *)0x0) {
        fprintf(__stream,"%s\n",pcVar1);
        __buf_00 = extraout_RDX_02;
      }
      else {
        fprintf(__stream,"%s:",pcVar1);
        sVar2 = 0;
        do {
          if (pcVar3[sVar2] == '\0') goto LAB_001c6125;
          sVar2 = sVar2 + 1;
        } while (sVar2 != 0x3c);
        sVar2 = 0x3c;
LAB_001c6125:
        __n = (size_t)__stream;
        fwrite(pcVar3,sVar2,1,__stream);
        fputc(10,__stream);
        __buf_00 = extraout_RDX_00;
        if (pcVar3[sVar2] != '\0') {
          pcVar3 = pcVar3 + sVar2;
          do {
            sVar2 = 0;
            do {
              if (pcVar3[sVar2] == '\0') goto LAB_001c6168;
              sVar2 = sVar2 + 1;
            } while (sVar2 != 0x50);
            sVar2 = 0x50;
LAB_001c6168:
            fputc(0x2b,__stream);
            __n = (size_t)__stream;
            fwrite(pcVar3,sVar2,1,__stream);
            fputc(10,__stream);
            pcVar1 = pcVar3 + sVar2;
            pcVar3 = pcVar3 + sVar2;
            __buf_00 = extraout_RDX_01;
          } while (*pcVar1 != '\0');
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < this->nEntry_);
  }
  if (this->child_ != (Node *)0x0) {
    write(this->child_,__fd,__buf_00,__n);
  }
  this->field_0x30 = this->field_0x30 & 0xfe;
  return 0;
}

Assistant:

int Fl_Preferences::Node::write( FILE *f ) {
  if ( next_ ) next_->write( f );
  fprintf( f, "\n[%s]\n\n", path_ );
  for ( int i = 0; i < nEntry_; i++ ) {
    char *src = entry_[i].value;
    if ( src ) {		// hack it into smaller pieces if needed
      fprintf( f, "%s:", entry_[i].name );
      size_t cnt, written = 0;
      for ( cnt = 0; cnt < 60; cnt++ )
	if ( src[cnt]==0 ) break;
      written += fwrite( src, cnt, 1, f );
      fprintf( f, "\n" );
      src += cnt;
      for (;*src;) {
	for ( cnt = 0; cnt < 80; cnt++ )
	  if ( src[cnt]==0 ) break;
        fputc( '+', f );
	written += fwrite( src, cnt, 1, f );
        fputc( '\n', f );
	src += cnt;
      }
    }
    else
      fprintf( f, "%s\n", entry_[i].name );
  }
  if ( child_ ) child_->write( f );
  dirty_ = 0;
  return 0;
}